

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers.h
# Opt level: O2

TypedVector * __thiscall
flexbuffers::Reference::AsTypedVector(TypedVector *__return_storage_ptr__,Reference *this)

{
  uint8_t byte_width;
  Type TVar1;
  Type TVar2;
  uint8_t *data;
  
  if (((ulong)this->type_ < 0x25) && ((0x100000f800U >> ((ulong)this->type_ & 0x3f) & 1) != 0)) {
    data = Indirect(this);
    byte_width = this->byte_width_;
    TVar1 = ToTypedVectorElementType(this->type_);
    Sized::Sized(&__return_storage_ptr__->super_Sized,data,byte_width);
    TVar2 = FBT_KEY;
    if (TVar1 != FBT_STRING) {
      TVar2 = TVar1;
    }
    __return_storage_ptr__->type_ = TVar2;
  }
  else {
    TypedVector::EmptyTypedVector();
  }
  return __return_storage_ptr__;
}

Assistant:

TypedVector AsTypedVector() const {
    if (IsTypedVector()) {
      auto tv =
          TypedVector(Indirect(), byte_width_, ToTypedVectorElementType(type_));
      if (tv.type_ == FBT_STRING) {
        // These can't be accessed as strings, since we don't know the bit-width
        // of the size field, see the declaration of
        // FBT_VECTOR_STRING_DEPRECATED above for details.
        // We change the type here to be keys, which are a subtype of strings,
        // and will ignore the size field. This will truncate strings with
        // embedded nulls.
        tv.type_ = FBT_KEY;
      }
      return tv;
    } else {
      return TypedVector::EmptyTypedVector();
    }
  }